

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess_test.cc
# Opt level: O0

void __thiscall SubprocessTestBadCommandStderr::Run(SubprocessTestBadCommandStderr *this)

{
  Test *pTVar1;
  bool bVar2;
  ExitStatus EVar3;
  Subprocess *pSVar4;
  string *__rhs;
  allocator<char> local_39;
  string local_38;
  Subprocess *local_18;
  Subprocess *subproc;
  SubprocessTestBadCommandStderr *this_local;
  
  subproc = (Subprocess *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"cmd /c ninja_no_such_command",&local_39);
  pSVar4 = SubprocessSet::Add(&(this->super_SubprocessTest).subprocs_,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = pSVar4;
  bVar2 = testing::Test::Check
                    (g_current_test,pSVar4 != (Subprocess *)0x0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                     ,0x45,"(Subprocess *) 0 != subproc");
  if (bVar2) {
    SubprocessSet::ResetTokenAvailable(&(this->super_SubprocessTest).subprocs_);
    while( true ) {
      bVar2 = Subprocess::Done(local_18);
      pTVar1 = g_current_test;
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      SubprocessSet::DoWork(&(this->super_SubprocessTest).subprocs_,(TokenPool *)0x0);
    }
    bVar2 = SubprocessSet::IsTokenAvailable(&(this->super_SubprocessTest).subprocs_);
    bVar2 = testing::Test::Check
                      (pTVar1,(bool)((bVar2 ^ 0xffU) & 1),
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                       ,0x4c,"subprocs_.IsTokenAvailable()");
    pTVar1 = g_current_test;
    if (bVar2) {
      EVar3 = Subprocess::Finish(local_18);
      testing::Test::Check
                (pTVar1,EVar3 == ExitFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                 ,0x4e,"ExitFailure == subproc->Finish()");
      pTVar1 = g_current_test;
      __rhs = Subprocess::GetOutput_abi_cxx11_(local_18);
      bVar2 = std::operator!=("",__rhs);
      testing::Test::Check
                (pTVar1,bVar2,
                 "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/subprocess_test.cc"
                 ,0x4f,"\"\" != subproc->GetOutput()");
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(SubprocessTest, BadCommandStderr) {
  Subprocess* subproc = subprocs_.Add("cmd /c ninja_no_such_command");
  ASSERT_NE((Subprocess *) 0, subproc);

  subprocs_.ResetTokenAvailable();
  while (!subproc->Done()) {
    // Pretend we discovered that stderr was ready for writing.
    subprocs_.DoWork(NULL);
  }
  ASSERT_FALSE(subprocs_.IsTokenAvailable());

  EXPECT_EQ(ExitFailure, subproc->Finish());
  EXPECT_NE("", subproc->GetOutput());
}